

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Mock::ClearDefaultActionsLocked(void *mock_obj)

{
  bool bVar1;
  size_type sVar2;
  iterator this;
  reference ppUVar3;
  const_iterator it;
  FunctionMockers *mockers;
  set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
  *in_stack_ffffffffffffffd8;
  _Self in_stack_ffffffffffffffe8;
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *in_stack_fffffffffffffff0;
  
  internal::MutexBase::AssertHeld((MutexBase *)it._M_node);
  anon_unknown_18::MockObjectRegistry::states
            ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  sVar2 = std::
          map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
          ::count(in_stack_fffffffffffffff0,(key_type *)in_stack_ffffffffffffffe8._M_node);
  if (sVar2 != 0) {
    anon_unknown_18::MockObjectRegistry::states
              ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
    std::
    map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
    ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                  *)mock_obj,(key_type *)mockers);
    std::
    set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
    ::begin(in_stack_ffffffffffffffd8);
    while( true ) {
      this = std::
             set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
             ::end(in_stack_ffffffffffffffd8);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffe0);
      if (!bVar1) break;
      ppUVar3 = std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::
                operator*((_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*> *
                          )this._M_node);
      (*(*ppUVar3)->_vptr_UntypedFunctionMockerBase[2])();
      std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::operator++
                ((_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*> *)
                 this._M_node);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();

  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No ON_CALL() was set on the given mock object.
    return;
  }

  // Clears the default actions for each mock method in the given mock
  // object.
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    (*it)->ClearDefaultActionsLocked();
  }

  // We don't clear the content of mockers, as they may still be
  // needed by VerifyAndClearExpectationsLocked().
}